

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltextureglyphcache.cpp
# Opt level: O1

void __thiscall
QOpenGLTextureGlyphCache::resizeTextureData(QOpenGLTextureGlyphCache *this,int width,int height)

{
  QOpenGLBuffer *this_00;
  char *pcVar1;
  int iVar2;
  socklen_t sVar3;
  QOpenGLGlyphTexture *pQVar4;
  QOpenGL2PaintEngineExPrivate *pQVar5;
  bool bVar6;
  GLuint GVar7;
  int iVar8;
  QOpenGLContext *ctx;
  long *plVar9;
  QOpenGLShaderProgram *pQVar10;
  sockaddr *__addr;
  sockaddr *__addr_00;
  char *pcVar11;
  sockaddr *__addr_01;
  sockaddr *__addr_02;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *__addr_03;
  char *pcVar12;
  socklen_t sVar13;
  long in_FS_OFFSET;
  QLatin1String QVar14;
  QLatin1String QVar15;
  QLatin1String QVar16;
  QLatin1String QVar17;
  QString local_68;
  GLuint tmp_texture;
  GLuint oldTexture;
  GLint oldFbo;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  ctx = (QOpenGLContext *)QOpenGLContext::currentContext();
  if (ctx == (QOpenGLContext *)0x0) {
    resizeTextureData();
  }
  else {
    plVar9 = (long *)QOpenGLContext::functions();
    oldFbo = -0x55555556;
    (**(code **)(*plVar9 + 200))(0x8ca6);
    pQVar4 = this->m_textureResource;
    if (width < 0x11) {
      width = 0x10;
    }
    iVar2 = pQVar4->m_width;
    sVar13 = 0x10;
    if (0x10 < height) {
      sVar13 = height;
    }
    sVar3 = pQVar4->m_height;
    oldTexture = pQVar4->m_texture;
    (**(code **)(*(long *)this + 0x10))(this,width,sVar13);
    if (*(char *)(*(long *)(ctx + 8) + 0xfc) == '\x01') {
      QImageTextureGlyphCache::resizeTextureData((int)this,width);
      if (iVar2 < width) {
        width = iVar2;
      }
      if ((int)sVar3 < (int)sVar13) {
        sVar13 = sVar3;
      }
      load_glyph_image_region_to_texture
                (ctx,(QImage *)&this->field_0xa0,0,0,width,sVar13,this->m_textureResource->m_texture
                 ,0,0);
    }
    else {
      GVar7 = this->m_textureResource->m_fbo;
      if (GVar7 == 0) {
        QOpenGLContext::currentContext();
        GVar7 = QOpenGLContext::defaultFramebufferObject();
      }
      (**(code **)(*plVar9 + 0x198))(0x8d40,GVar7);
      tmp_texture = 0xaaaaaaaa;
      (**(code **)(*plVar9 + 0xa8))(1,&tmp_texture);
      (**(code **)*plVar9)(0xde1,tmp_texture);
      (**(code **)(*plVar9 + 0x140))(0xde1,0,0x1908,iVar2,sVar3,0,0x1908,0x1401,0);
      (**(code **)(*plVar9 + 0x158))(0xde1,0x2801,0x2600);
      (**(code **)(*plVar9 + 0x158))(0xde1,0x2800,0x2600);
      (**(code **)(*plVar9 + 0x158))(0xde1,0x2802,0x812f);
      (**(code **)(*plVar9 + 0x158))(0xde1,0x2803,0x812f);
      this->m_filterMode = Nearest;
      (**(code **)*plVar9)(0xde1,0);
      (**(code **)(*plVar9 + 0x250))(0x8d40,0x8ce0,0xde1,tmp_texture,0);
      (**(code **)(*plVar9 + 0x178))(0x84c0);
      (**(code **)*plVar9)(0xde1);
      if (this->pex != (QOpenGL2PaintEngineExPrivate *)0x0) {
        QOpenGL2PaintEngineExPrivate::transferMode(this->pex,BrushDrawingMode);
      }
      (**(code **)(*plVar9 + 0x70))(0xb90);
      (**(code **)(*plVar9 + 0x70))(0xb71);
      (**(code **)(*plVar9 + 0x70))(0xc11);
      (**(code **)(*plVar9 + 0x70))(0xbe2);
      iVar8 = 0;
      sVar13 = sVar3;
      (**(code **)(*plVar9 + 0x170))(0,0,iVar2);
      pQVar5 = this->pex;
      if (pQVar5 == (QOpenGL2PaintEngineExPrivate *)0x0) {
        if (this->m_blitProgram == (QOpenGLShaderProgram *)0x0) {
          pQVar10 = (QOpenGLShaderProgram *)operator_new(0x10);
          QOpenGLShaderProgram::QOpenGLShaderProgram(pQVar10,(QObject *)0x0);
          this->m_blitProgram = pQVar10;
          QOpenGLContext::format();
          iVar8 = QSurfaceFormat::profile();
          QSurfaceFormat::~QSurfaceFormat((QSurfaceFormat *)&local_68);
          local_68.d.d = (Data *)0x0;
          local_68.d.ptr = (char16_t *)0x0;
          local_68.d.size = 0;
          pcVar11 = 
          "\n    attribute highp   vec2      textureCoordArray; \n    varying   highp   vec2      textureCoords; \n    void setPosition(); \n    void main(void) \n    { \n        setPosition(); \n        textureCoords = textureCoordArray; \n    }\n"
          ;
          if (iVar8 == 1) {
            pcVar11 = 
            "#version 150 core\n    in      vec2      textureCoordArray; \n    out     vec2      textureCoords; \n    void setPosition(); \n    void main(void) \n    { \n        setPosition(); \n        textureCoords = textureCoordArray; \n    }\n"
            ;
          }
          pcVar12 = (char *)0xffffffffffffffff;
          do {
            pcVar1 = pcVar12 + (long)(pcVar11 + 1);
            pcVar12 = pcVar12 + 1;
          } while (*pcVar1 != '\0');
          QVar14.m_data = pcVar12;
          QVar14.m_size = (qsizetype)&local_68;
          QString::append(QVar14);
          pcVar11 = 
          "\n    attribute highp   vec4      vertexCoordsArray; \n    void setPosition(void) \n    { \n        gl_Position = vertexCoordsArray; \n    }\n"
          ;
          if (iVar8 == 1) {
            pcVar11 = 
            "\n    in      vec4      vertexCoordsArray; \n    void setPosition(void) \n    { \n        gl_Position = vertexCoordsArray; \n    }\n"
            ;
          }
          pcVar12 = (char *)0xffffffffffffffff;
          do {
            pcVar1 = pcVar12 + (long)(pcVar11 + 1);
            pcVar12 = pcVar12 + 1;
          } while (*pcVar1 != '\0');
          QVar15.m_data = pcVar12;
          QVar15.m_size = (qsizetype)&local_68;
          QString::append(QVar15);
          QOpenGLShaderProgram::addCacheableShaderFromSourceCode
                    (this->m_blitProgram,(ShaderType)0x1,&local_68);
          if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
            }
          }
          local_68.d.d = (Data *)0x0;
          local_68.d.ptr = (char16_t *)0x0;
          local_68.d.size = 0;
          pcVar11 = 
          "\n    lowp vec4 srcPixel(); \n    void main() \n    { \n        gl_FragColor = srcPixel(); \n    }\n"
          ;
          if (iVar8 == 1) {
            pcVar11 = 
            "#version 150 core\n    out     vec4      fragColor; \n    vec4 srcPixel(); \n    void main() \n    { \n        fragColor = srcPixel(); \n    }\n"
            ;
          }
          pcVar12 = (char *)0xffffffffffffffff;
          do {
            pcVar1 = pcVar12 + (long)(pcVar11 + 1);
            pcVar12 = pcVar12 + 1;
          } while (*pcVar1 != '\0');
          QVar16.m_data = pcVar12;
          QVar16.m_size = (qsizetype)&local_68;
          QString::append(QVar16);
          pcVar11 = 
          "\n    varying   highp   vec2      textureCoords; \n    uniform           sampler2D imageTexture; \n    lowp vec4 srcPixel() \n    { \nreturn texture2D(imageTexture, textureCoords); \n}\n"
          ;
          if (iVar8 == 1) {
            pcVar11 = 
            "\n    in      vec2      textureCoords; \n    uniform sampler2D imageTexture; \n    vec4 srcPixel() \n    { \n        return texture(imageTexture, textureCoords); \n    }\n"
            ;
          }
          pcVar12 = (char *)0xffffffffffffffff;
          do {
            pcVar1 = pcVar12 + (long)(pcVar11 + 1);
            pcVar12 = pcVar12 + 1;
          } while (*pcVar1 != '\0');
          QVar17.m_data = pcVar12;
          QVar17.m_size = (qsizetype)&local_68;
          QString::append(QVar17);
          QOpenGLShaderProgram::addCacheableShaderFromSourceCode
                    (this->m_blitProgram,(ShaderType)0x2,&local_68);
          if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
            }
          }
          QOpenGLShaderProgram::bindAttributeLocation(this->m_blitProgram,"vertexCoordsArray",0);
          iVar8 = 0x17f449;
          QOpenGLShaderProgram::bindAttributeLocation(this->m_blitProgram,"textureCoordArray",1);
          (**(code **)(*(long *)this->m_blitProgram + 0x60))();
          bVar6 = QOpenGLVertexArrayObject::isCreated(&this->m_vao);
          if (bVar6) {
            QOpenGLVertexArrayObject::bind(&this->m_vao,iVar8,__addr_01,sVar13);
            setupVertexAttribs(this);
          }
        }
        bVar6 = QOpenGLVertexArrayObject::isCreated(&this->m_vao);
        if (bVar6) {
          QOpenGLVertexArrayObject::bind(&this->m_vao,iVar8,__addr_02,sVar13);
          __addr_03 = extraout_RDX;
        }
        else {
          setupVertexAttribs(this);
          __addr_03 = extraout_RDX_00;
        }
        QOpenGLShaderProgram::bind(this->m_blitProgram,iVar8,__addr_03,sVar13);
        pQVar10 = this->m_blitProgram;
      }
      else {
        QOpenGLBuffer::bind(&pQVar5->vertexBuffer,iVar8,__addr,sVar13);
        QOpenGLBuffer::allocate(&pQVar5->vertexBuffer,this->m_vertexCoordinateArray,0x20);
        iVar8 = 2;
        sVar13 = 0;
        (**(code **)(*(long *)&pQVar5->funcs + 0x468))(0,2,0x1406,0,0,0);
        pQVar5 = this->pex;
        this_00 = &pQVar5->texCoordBuffer;
        QOpenGLBuffer::bind(this_00,iVar8,__addr_00,sVar13);
        QOpenGLBuffer::allocate(this_00,this->m_textureCoordinateArray,0x20);
        (**(code **)(*(long *)&pQVar5->funcs + 0x468))(1,2,0x1406,0,0,0);
        QOpenGLEngineShaderManager::useBlitProgram
                  ((QOpenGLEngineShaderManager *)this->pex->shaderManager);
        pQVar10 = QOpenGLEngineShaderManager::blitProgram
                            ((QOpenGLEngineShaderManager *)this->pex->shaderManager);
      }
      QOpenGLShaderProgram::setUniformValue(pQVar10,"imageTexture",0);
      (**(code **)(*plVar9 + 0x78))(6,0,4);
      (**(code **)*plVar9)(0xde1,this->m_textureResource->m_texture);
      (**(code **)(*plVar9 + 0x40))(0xde1,0,0,0,0,0,iVar2,sVar3);
      (**(code **)(*plVar9 + 0x248))(0x8d40,0x8ce0,0x8d41,0);
      (**(code **)(*plVar9 + 0x50))(1,&tmp_texture);
      (**(code **)(*plVar9 + 0x50))(1,&oldTexture);
      if (oldFbo == 0) {
        QOpenGLContext::currentContext();
        QOpenGLContext::defaultFramebufferObject();
      }
      (**(code **)(*plVar9 + 0x198))(0x8d40);
      pQVar5 = this->pex;
      if (pQVar5 == (QOpenGL2PaintEngineExPrivate *)0x0) {
        bVar6 = QOpenGLVertexArrayObject::isCreated(&this->m_vao);
        if (bVar6) {
          QOpenGLVertexArrayObject::release(&this->m_vao);
        }
        else {
          QOpenGLShaderProgram::disableAttributeArray(this->m_blitProgram,0);
          QOpenGLShaderProgram::disableAttributeArray(this->m_blitProgram,1);
        }
      }
      else {
        (**(code **)(*plVar9 + 0x170))(0,0,pQVar5->width,pQVar5->height);
        QOpenGL2PaintEngineExPrivate::updateClipScissorTest(this->pex);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QOpenGLTextureGlyphCache::resizeTextureData(int width, int height)
{
    QOpenGLContext *ctx = QOpenGLContext::currentContext();
    if (ctx == nullptr) {
        qWarning("QOpenGLTextureGlyphCache::resizeTextureData: Called with no context");
        return;
    }

    QOpenGLFunctions *funcs = ctx->functions();
    GLint oldFbo;
    funcs->glGetIntegerv(GL_FRAMEBUFFER_BINDING, &oldFbo);

    int oldWidth = m_textureResource->m_width;
    int oldHeight = m_textureResource->m_height;

    // Make the lower glyph texture size 16 x 16.
    if (width < 16)
        width = 16;
    if (height < 16)
        height = 16;

    GLuint oldTexture = m_textureResource->m_texture;
    createTextureData(width, height);

    if (ctx->d_func()->workaround_brokenFBOReadBack) {
        QImageTextureGlyphCache::resizeTextureData(width, height);
        load_glyph_image_region_to_texture(ctx, image(), 0, 0, qMin(oldWidth, width), qMin(oldHeight, height),
                                           m_textureResource->m_texture, 0, 0);
        return;
    }

    // ### the QTextureGlyphCache API needs to be reworked to allow
    // ### resizeTextureData to fail

    funcs->glBindFramebuffer(GL_FRAMEBUFFER, m_textureResource->m_fbo);

    GLuint tmp_texture;
    funcs->glGenTextures(1, &tmp_texture);
    funcs->glBindTexture(GL_TEXTURE_2D, tmp_texture);
    funcs->glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA, oldWidth, oldHeight, 0,
                        GL_RGBA, GL_UNSIGNED_BYTE, nullptr);
    funcs->glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
    funcs->glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
    funcs->glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
    funcs->glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
    m_filterMode = Nearest;
    funcs->glBindTexture(GL_TEXTURE_2D, 0);
    funcs->glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0,
                                  GL_TEXTURE_2D, tmp_texture, 0);

    funcs->glActiveTexture(GL_TEXTURE0 + QT_IMAGE_TEXTURE_UNIT);
    funcs->glBindTexture(GL_TEXTURE_2D, oldTexture);

    if (pex != nullptr)
        pex->transferMode(BrushDrawingMode);

    funcs->glDisable(GL_STENCIL_TEST);
    funcs->glDisable(GL_DEPTH_TEST);
    funcs->glDisable(GL_SCISSOR_TEST);
    funcs->glDisable(GL_BLEND);

    funcs->glViewport(0, 0, oldWidth, oldHeight);

    QOpenGLShaderProgram *blitProgram = nullptr;
    if (pex == nullptr) {
        if (m_blitProgram == nullptr) {
            m_blitProgram = new QOpenGLShaderProgram;
            const bool isCoreProfile = ctx->format().profile() == QSurfaceFormat::CoreProfile;

            {
                QString source;
#ifdef Q_OS_WASM
                source.append(QLatin1StringView(isCoreProfile ? qopenglslUntransformedPositionVertexShader_core : qopenglslUntransformedPositionVertexShader));
                source.append(QLatin1StringView(isCoreProfile ? qopenglslMainWithTexCoordsVertexShader_core : qopenglslMainWithTexCoordsVertexShader));
#else
                source.append(QLatin1StringView(isCoreProfile ? qopenglslMainWithTexCoordsVertexShader_core : qopenglslMainWithTexCoordsVertexShader));
                source.append(QLatin1StringView(isCoreProfile ? qopenglslUntransformedPositionVertexShader_core : qopenglslUntransformedPositionVertexShader));
#endif
                m_blitProgram->addCacheableShaderFromSourceCode(QOpenGLShader::Vertex, source);
            }

            {
                QString source;
#ifdef Q_OS_WASM
                source.append(QLatin1StringView(isCoreProfile ? qopenglslImageSrcFragmentShader_core : qopenglslImageSrcFragmentShader));
                source.append(QLatin1StringView(isCoreProfile ? qopenglslMainFragmentShader_core : qopenglslMainFragmentShader));
#else
                source.append(QLatin1StringView(isCoreProfile ? qopenglslMainFragmentShader_core : qopenglslMainFragmentShader));
                source.append(QLatin1StringView(isCoreProfile ? qopenglslImageSrcFragmentShader_core : qopenglslImageSrcFragmentShader));
#endif
                m_blitProgram->addCacheableShaderFromSourceCode(QOpenGLShader::Fragment, source);
            }

            m_blitProgram->bindAttributeLocation("vertexCoordsArray", QT_VERTEX_COORDS_ATTR);
            m_blitProgram->bindAttributeLocation("textureCoordArray", QT_TEXTURE_COORDS_ATTR);

            m_blitProgram->link();

            if (m_vao.isCreated()) {
                m_vao.bind();
                setupVertexAttribs();
            }
        }

        if (m_vao.isCreated())
            m_vao.bind();
        else
            setupVertexAttribs();

        m_blitProgram->bind();
        blitProgram = m_blitProgram;

    } else {
        pex->uploadData(QT_VERTEX_COORDS_ATTR, m_vertexCoordinateArray, 8);
        pex->uploadData(QT_TEXTURE_COORDS_ATTR, m_textureCoordinateArray, 8);

        pex->shaderManager->useBlitProgram();
        blitProgram = pex->shaderManager->blitProgram();
    }

    blitProgram->setUniformValue("imageTexture", QT_IMAGE_TEXTURE_UNIT);

    funcs->glDrawArrays(GL_TRIANGLE_FAN, 0, 4);

    funcs->glBindTexture(GL_TEXTURE_2D, m_textureResource->m_texture);

    funcs->glCopyTexSubImage2D(GL_TEXTURE_2D, 0, 0, 0, 0, 0, oldWidth, oldHeight);

    funcs->glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0,
                                     GL_RENDERBUFFER, 0);
    funcs->glDeleteTextures(1, &tmp_texture);
    funcs->glDeleteTextures(1, &oldTexture);

    funcs->glBindFramebuffer(GL_FRAMEBUFFER, (GLuint)oldFbo);

    if (pex != nullptr) {
        funcs->glViewport(0, 0, pex->width, pex->height);
        pex->updateClipScissorTest();
    } else {
        if (m_vao.isCreated()) {
            m_vao.release();
        } else {
            m_blitProgram->disableAttributeArray(int(QT_VERTEX_COORDS_ATTR));
            m_blitProgram->disableAttributeArray(int(QT_TEXTURE_COORDS_ATTR));
        }
    }
}